

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall FfsParser::parsePeImageSectionBody(FfsParser *this,UModelIndex *index)

{
  bool bVar1;
  uint uVar2;
  int32_t iVar3;
  char *pcVar4;
  undefined8 in_stack_fffffffffffffd18;
  undefined4 uVar5;
  CBString local_2a0;
  CBString local_288;
  CBString local_270;
  CBString local_258;
  CBString local_240;
  CBString local_228;
  uint *local_210;
  EFI_IMAGE_OPTIONAL_HEADER_POINTERS_UNION optionalHeader;
  CBString local_1f0;
  CBString local_1d8;
  CBString local_1c0;
  CBString local_1a8;
  CBString local_190;
  CBString local_178;
  CBString local_160;
  CBString local_148;
  uint *local_130;
  EFI_IMAGE_FILE_HEADER *imageFileHeader;
  CBString local_110;
  CBString local_f8;
  CBString local_e0;
  uint *local_c8;
  EFI_IMAGE_PE_HEADER *peHeader;
  CBString local_a8;
  ushort *local_90;
  EFI_IMAGE_DOS_HEADER *dosHeader;
  CBString info;
  CBString local_68;
  undefined1 local_40 [8];
  UByteArray body;
  UModelIndex *index_local;
  FfsParser *this_local;
  
  uVar5 = (undefined4)((ulong)in_stack_fffffffffffffd18 >> 0x20);
  body.d.field_2._8_8_ = index;
  bVar1 = UModelIndex::isValid(index);
  if (bVar1) {
    TreeModel::body((UByteArray *)local_40,this->model,(UModelIndex *)body.d.field_2._8_8_);
    uVar2 = UByteArray::size((UByteArray *)local_40);
    if (uVar2 < 0x40) {
      usprintf(&local_68,"%s: section body size is smaller than DOS header size",
               "parsePeImageSectionBody");
      msg(this,&local_68,(UModelIndex *)body.d.field_2._8_8_);
      Bstrlib::CBString::~CBString(&local_68);
      info.super_tagbstring.data._4_4_ = 1;
    }
    else {
      Bstrlib::CBString::CBString((CBString *)&dosHeader);
      local_90 = (ushort *)UByteArray::constData((UByteArray *)local_40);
      if (*local_90 == 0x5a4d) {
        pcVar4 = UByteArray::constData((UByteArray *)local_40);
        local_c8 = (uint *)(pcVar4 + *(uint *)(local_90 + 0x1e));
        iVar3 = UByteArray::size((UByteArray *)local_40);
        if ((long)iVar3 < (long)local_c8 - (long)local_90) {
          Bstrlib::CBString::CBString(&local_e0,"\nDOS header: invalid");
          Bstrlib::CBString::operator+=((CBString *)&dosHeader,&local_e0);
          Bstrlib::CBString::~CBString(&local_e0);
          usprintf(&local_f8,"%s: PE32 image with invalid DOS header","parsePeImageSectionBody");
          msg(this,&local_f8,(UModelIndex *)body.d.field_2._8_8_);
          Bstrlib::CBString::~CBString(&local_f8);
          TreeModel::addInfo(this->model,(UModelIndex *)body.d.field_2._8_8_,(CBString *)&dosHeader,
                             true);
        }
        else if (*local_c8 == 0x4550) {
          local_130 = local_c8 + 1;
          iVar3 = UByteArray::size((UByteArray *)local_40);
          if ((long)iVar3 < (long)local_130 - (long)local_90) {
            Bstrlib::CBString::CBString(&local_148,"\nPE header: invalid");
            Bstrlib::CBString::operator+=((CBString *)&dosHeader,&local_148);
            Bstrlib::CBString::~CBString(&local_148);
            usprintf(&local_160,"%s: PE32 image with invalid PE header","parsePeImageSectionBody");
            msg(this,&local_160,(UModelIndex *)body.d.field_2._8_8_);
            Bstrlib::CBString::~CBString(&local_160);
            TreeModel::addInfo(this->model,(UModelIndex *)body.d.field_2._8_8_,
                               (CBString *)&dosHeader,true);
          }
          else {
            usprintf(&local_1c0,"\nDOS signature: %04Xh\nPE signature: %08Xh",(ulong)*local_90,
                     (ulong)*local_c8);
            Bstrlib::CBString::CBString(&local_1d8,"\nMachine type: ");
            Bstrlib::CBString::operator+(&local_1a8,&local_1c0,&local_1d8);
            machineTypeToUString(&local_1f0,(UINT16)*local_130);
            Bstrlib::CBString::operator+(&local_190,&local_1a8,&local_1f0);
            usprintf((CBString *)&optionalHeader,"\nNumber of sections: %u\nCharacteristics: %04Xh",
                     (ulong)*(UINT16 *)((long)local_130 + 2),
                     (ulong)*(UINT16 *)((long)local_130 + 0x12));
            Bstrlib::CBString::operator+(&local_178,&local_190,(CBString *)&optionalHeader);
            Bstrlib::CBString::operator+=((CBString *)&dosHeader,&local_178);
            Bstrlib::CBString::~CBString(&local_178);
            Bstrlib::CBString::~CBString((CBString *)&optionalHeader);
            Bstrlib::CBString::~CBString(&local_190);
            Bstrlib::CBString::~CBString(&local_1f0);
            Bstrlib::CBString::~CBString(&local_1a8);
            Bstrlib::CBString::~CBString(&local_1d8);
            Bstrlib::CBString::~CBString(&local_1c0);
            local_210 = local_130 + 5;
            iVar3 = UByteArray::size((UByteArray *)local_40);
            if ((long)iVar3 < (long)local_210 - (long)local_90) {
              Bstrlib::CBString::CBString(&local_228,"\nPE optional header: invalid");
              Bstrlib::CBString::operator+=((CBString *)&dosHeader,&local_228);
              Bstrlib::CBString::~CBString(&local_228);
              usprintf(&local_240,"%s: PE32 image with invalid PE optional header",
                       "parsePeImageSectionBody");
              msg(this,&local_240,(UModelIndex *)body.d.field_2._8_8_);
              Bstrlib::CBString::~CBString(&local_240);
              TreeModel::addInfo(this->model,(UModelIndex *)body.d.field_2._8_8_,
                                 (CBString *)&dosHeader,true);
            }
            else {
              if ((UINT16)*local_210 == 0x10b) {
                usprintf(&local_258,
                         "\nOptional header signature: %04Xh\nSubsystem: %04Xh\nAddress of entry point: %Xh\nBase of code: %Xh\nImage base: %Xh"
                         ,(ulong)(ushort)*local_210,(ulong)(ushort)local_210[0x11],
                         (ulong)local_210[4],(ulong)local_210[5],CONCAT44(uVar5,local_210[7]));
                Bstrlib::CBString::operator+=((CBString *)&dosHeader,&local_258);
                Bstrlib::CBString::~CBString(&local_258);
              }
              else if ((UINT16)*local_210 == 0x20b) {
                usprintf(&local_270,
                         "\nOptional header signature: %04Xh\nSubsystem: %04Xh\nAddress of entry point: %Xh\nBase of code: %Xh\nImage base: %lXh"
                         ,(ulong)(ushort)*local_210,(ulong)(ushort)local_210[0x11],
                         (ulong)local_210[4],(ulong)local_210[5],*(undefined8 *)(local_210 + 6));
                Bstrlib::CBString::operator+=((CBString *)&dosHeader,&local_270);
                Bstrlib::CBString::~CBString(&local_270);
              }
              else {
                usprintf(&local_288,"\nOptional header signature: %04Xh, unknown",
                         (ulong)(ushort)*local_210);
                Bstrlib::CBString::operator+=((CBString *)&dosHeader,&local_288);
                Bstrlib::CBString::~CBString(&local_288);
                usprintf(&local_2a0,"%s: PE32 image with invalid optional PE header signature",
                         "parsePeImageSectionBody");
                msg(this,&local_2a0,(UModelIndex *)body.d.field_2._8_8_);
                Bstrlib::CBString::~CBString(&local_2a0);
              }
              TreeModel::addInfo(this->model,(UModelIndex *)body.d.field_2._8_8_,
                                 (CBString *)&dosHeader,true);
            }
          }
        }
        else {
          usprintf(&local_110,"\nPE signature: %08Xh, invalid",(ulong)*local_c8);
          Bstrlib::CBString::operator+=((CBString *)&dosHeader,&local_110);
          Bstrlib::CBString::~CBString(&local_110);
          usprintf((CBString *)&imageFileHeader,"%s: PE32 image with invalid PE signature",
                   "parsePeImageSectionBody");
          msg(this,(CBString *)&imageFileHeader,(UModelIndex *)body.d.field_2._8_8_);
          Bstrlib::CBString::~CBString((CBString *)&imageFileHeader);
          TreeModel::addInfo(this->model,(UModelIndex *)body.d.field_2._8_8_,(CBString *)&dosHeader,
                             true);
        }
      }
      else {
        usprintf(&local_a8,"\nDOS signature: %04Xh, invalid",(ulong)*local_90);
        Bstrlib::CBString::operator+=((CBString *)&dosHeader,&local_a8);
        Bstrlib::CBString::~CBString(&local_a8);
        usprintf((CBString *)&peHeader,"%s: PE32 image with invalid DOS signature",
                 "parsePeImageSectionBody");
        msg(this,(CBString *)&peHeader,(UModelIndex *)body.d.field_2._8_8_);
        Bstrlib::CBString::~CBString((CBString *)&peHeader);
        TreeModel::addInfo(this->model,(UModelIndex *)body.d.field_2._8_8_,(CBString *)&dosHeader,
                           true);
      }
      info.super_tagbstring.data._4_4_ = 1;
      Bstrlib::CBString::~CBString((CBString *)&dosHeader);
    }
    this_local = (FfsParser *)0x0;
    UByteArray::~UByteArray((UByteArray *)local_40);
  }
  else {
    this_local = (FfsParser *)0x1;
  }
  return (USTATUS)this_local;
}

Assistant:

USTATUS FfsParser::parsePeImageSectionBody(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return U_INVALID_PARAMETER;
    
    // Get section body
    UByteArray body = model->body(index);
    if ((UINT32)body.size() < sizeof(EFI_IMAGE_DOS_HEADER)) {
        msg(usprintf("%s: section body size is smaller than DOS header size", __FUNCTION__), index);
        return U_SUCCESS;
    }
    
    UString info;
    const EFI_IMAGE_DOS_HEADER* dosHeader = (const EFI_IMAGE_DOS_HEADER*)body.constData();
    if (dosHeader->e_magic != EFI_IMAGE_DOS_SIGNATURE) {
        info += usprintf("\nDOS signature: %04Xh, invalid", dosHeader->e_magic);
        msg(usprintf("%s: PE32 image with invalid DOS signature", __FUNCTION__), index);
        model->addInfo(index, info);
        return U_SUCCESS;
    }
    
    const EFI_IMAGE_PE_HEADER* peHeader = (EFI_IMAGE_PE_HEADER*)(body.constData() + dosHeader->e_lfanew);
    if (body.size() < (UINT8*)peHeader - (UINT8*)dosHeader) {
        info += UString("\nDOS header: invalid");
        msg(usprintf("%s: PE32 image with invalid DOS header", __FUNCTION__), index);
        model->addInfo(index, info);
        return U_SUCCESS;
    }
    
    if (peHeader->Signature != EFI_IMAGE_PE_SIGNATURE) {
        info += usprintf("\nPE signature: %08Xh, invalid", peHeader->Signature);
        msg(usprintf("%s: PE32 image with invalid PE signature", __FUNCTION__), index);
        model->addInfo(index, info);
        return U_SUCCESS;
    }
    
    const EFI_IMAGE_FILE_HEADER* imageFileHeader = (const EFI_IMAGE_FILE_HEADER*)(peHeader + 1);
    if (body.size() < (UINT8*)imageFileHeader - (UINT8*)dosHeader) {
        info += UString("\nPE header: invalid");
        msg(usprintf("%s: PE32 image with invalid PE header", __FUNCTION__), index);
        model->addInfo(index, info);
        return U_SUCCESS;
    }
    
    info += usprintf("\nDOS signature: %04Xh\nPE signature: %08Xh",
                     dosHeader->e_magic,
                     peHeader->Signature) +
    UString("\nMachine type: ") + machineTypeToUString(imageFileHeader->Machine) +
    usprintf("\nNumber of sections: %u\nCharacteristics: %04Xh",
             imageFileHeader->NumberOfSections,
             imageFileHeader->Characteristics);
    
    EFI_IMAGE_OPTIONAL_HEADER_POINTERS_UNION optionalHeader = {};
    optionalHeader.H32 = (const EFI_IMAGE_OPTIONAL_HEADER32*)(imageFileHeader + 1);
    if (body.size() < (UINT8*)optionalHeader.H32 - (UINT8*)dosHeader) {
        info += UString("\nPE optional header: invalid");
        msg(usprintf("%s: PE32 image with invalid PE optional header", __FUNCTION__), index);
        model->addInfo(index, info);
        return U_SUCCESS;
    }
    
    if (optionalHeader.H32->Magic == EFI_IMAGE_PE_OPTIONAL_HDR32_MAGIC) {
        info += usprintf("\nOptional header signature: %04Xh\nSubsystem: %04Xh\nAddress of entry point: %Xh\nBase of code: %Xh\nImage base: %Xh",
                         optionalHeader.H32->Magic,
                         optionalHeader.H32->Subsystem,
                         optionalHeader.H32->AddressOfEntryPoint,
                         optionalHeader.H32->BaseOfCode,
                         optionalHeader.H32->ImageBase);
    }
    else if (optionalHeader.H32->Magic == EFI_IMAGE_PE_OPTIONAL_HDR64_MAGIC) {
        info += usprintf("\nOptional header signature: %04Xh\nSubsystem: %04Xh\nAddress of entry point: %Xh\nBase of code: %Xh\nImage base: %" PRIX64 "h",
                         optionalHeader.H64->Magic,
                         optionalHeader.H64->Subsystem,
                         optionalHeader.H64->AddressOfEntryPoint,
                         optionalHeader.H64->BaseOfCode,
                         optionalHeader.H64->ImageBase);
    }
    else {
        info += usprintf("\nOptional header signature: %04Xh, unknown", optionalHeader.H32->Magic);
        msg(usprintf("%s: PE32 image with invalid optional PE header signature", __FUNCTION__), index);
    }
    
    model->addInfo(index, info);
    return U_SUCCESS;
}